

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary_gnu_ds(arg_dstr_t ds,void **argtable)

{
  char cVar1;
  byte *pbVar2;
  char *__s;
  ushort *puVar3;
  uint uVar4;
  size_t sVar5;
  ushort **ppuVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  char *in_stack_fffffffffffffee8;
  uint local_f8 [50];
  
  lVar7 = 0;
  do {
    pbVar2 = (byte *)argtable[lVar7];
    if ((*pbVar2 & 1) != 0) {
      arg_dstr_cat(ds,"\n");
      return;
    }
    if (*(long *)(pbVar2 + 0x20) != 0) {
      memset(local_f8,0,200);
      if (*(char **)(pbVar2 + 0x10) != (char *)0x0 && *(size_t *)(pbVar2 + 8) == 0) {
        local_f8[0] = 0x20202020;
      }
      __s = *(char **)(pbVar2 + 0x20);
      arg_cat_optionv((char *)local_f8,*(size_t *)(pbVar2 + 8),*(char **)(pbVar2 + 0x10),
                      *(char **)(pbVar2 + 0x18),(char *)(ulong)(*pbVar2 & 4),0x10c716,
                      in_stack_fffffffffffffee8);
      sVar5 = strlen((char *)local_f8);
      if (0x19 < sVar5) {
        arg_dstr_catf(ds,"  %-25s %s\n",local_f8,"");
        local_f8[0] = local_f8[0] & 0xffffff00;
      }
      arg_dstr_catf(ds,"  %-25s ",local_f8);
      sVar5 = strlen(__s);
      if (0xfffffffe < sVar5) {
        __assert_fail("strlen(text) < UINT_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                      ,0x16c5,
                      "void arg_print_formatted_ds(arg_dstr_t, const unsigned int, const unsigned int, const char *)"
                     );
      }
      uVar12 = 0;
      uVar14 = sVar5 & 0xffffffff;
      while (uVar12 < (uint)uVar14) {
        ppuVar6 = __ctype_b_loc();
        puVar3 = *ppuVar6;
        uVar10 = (ulong)(uVar12 - 1);
        uVar4 = uVar12 + 0x35;
        do {
          uVar8 = uVar4;
          uVar12 = uVar12 + 1;
          iVar11 = (int)uVar10;
          uVar9 = iVar11 + 1;
          uVar10 = (ulong)uVar9;
          cVar1 = __s[uVar10];
          if ((long)cVar1 == 10) break;
          uVar4 = uVar8 + 1;
        } while ((puVar3[cVar1] & 0x2000) != 0);
        if (0x34 < (uint)uVar14 - uVar9) {
          uVar14 = (ulong)(iVar11 + 0x35);
          iVar11 = -0x34;
          uVar13 = uVar14;
          while ((uVar9 < (uint)uVar13 &&
                 ((*(byte *)((long)puVar3 + (long)__s[uVar13] * 2 + 1) & 0x20) == 0))) {
            uVar13 = (ulong)((uint)uVar13 - 1);
            iVar11 = iVar11 + 1;
            uVar8 = uVar8 - 1;
          }
          if (iVar11 != 0) {
            do {
              uVar14 = (ulong)uVar8;
              uVar8 = uVar8 - 1;
              if ((uVar8 <= uVar9) || (cVar1 == '\n')) break;
            } while ((puVar3[__s[uVar8]] & 0x2000) != 0);
          }
        }
        for (; uVar10 < uVar14; uVar10 = uVar10 + 1) {
          if (__s[uVar10] == '\n') goto LAB_00109271;
          arg_dstr_catc(ds,__s[uVar10]);
          uVar12 = uVar12 + 1;
        }
        uVar12 = uVar12 - 1;
LAB_00109271:
        arg_dstr_cat(ds,"\n");
        if ((uint)uVar14 < (uint)sVar5) {
          iVar11 = 0x1c;
          while (bVar15 = iVar11 != 0, iVar11 = iVar11 + -1, bVar15) {
            arg_dstr_cat(ds," ");
          }
          uVar14 = sVar5 & 0xffffffff;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void arg_print_glossary_gnu_ds(arg_dstr_t ds, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;

            if (!shortopts && longopts) {
                /* Indent trailing line by 4 spaces... */
                memset(syntax, ' ', 4);
                *(syntax + 4) = '\0';
            }

            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");

            /* If syntax fits not into column, print glossary in new line... */
            if (strlen(syntax) > 25) {
                arg_dstr_catf(ds, "  %-25s %s\n", syntax, "");
                *syntax = '\0';
            }

            arg_dstr_catf(ds, "  %-25s ", syntax);
            arg_print_formatted_ds(ds, 28, 79, glossary);
        }
    } /* for each table entry */

    arg_dstr_cat(ds, "\n");
}